

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O3

int __thiscall ProcessesView::getRowIndexByPid(ProcessesView *this,QString *pid)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  QStringView QVar6;
  QStringView QVar7;
  QString row_pid;
  int local_9c;
  QArrayData *local_98;
  storage_type_conflict *local_90;
  long local_88;
  anon_union_24_3_e3d07ef4_for_data local_80;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  plVar3 = (long *)QAbstractItemView::model();
  local_80._forAlignment = -NAN;
  local_80._8_8_ = 0;
  local_80._16_8_ = 0;
  iVar1 = (**(code **)(*plVar3 + 0x78))(plVar3);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      plVar3 = (long *)QAbstractItemView::model();
      plVar4 = (long *)QAbstractItemView::model();
      local_60 = 0xffffffffffffffff;
      local_58 = 0;
      uStack_50 = 0;
      (**(code **)(*plVar4 + 0x60))(local_48,plVar4,iVar1,3,&local_60);
      (**(code **)(*plVar3 + 0x90))(&local_80,plVar3,local_48,0);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&local_80);
      if (local_88 == (pid->d).size) {
        QVar6.m_data = local_90;
        QVar6.m_size = local_88;
        QVar7.m_data = (pid->d).ptr;
        QVar7.m_size = local_88;
        iVar2 = QtPrivate::compareStrings(QVar6,QVar7,CaseSensitive);
        bVar5 = iVar2 == 0;
        if (bVar5) {
          local_9c = iVar1;
        }
      }
      else {
        bVar5 = false;
      }
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,2,8);
        }
      }
      if (bVar5) {
        return local_9c;
      }
      iVar1 = iVar1 + 1;
      plVar3 = (long *)QAbstractItemView::model();
      local_80._forAlignment = -NAN;
      local_80._8_8_ = 0;
      local_80._16_8_ = 0;
      iVar2 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_80);
    } while (iVar1 < iVar2);
  }
  return -1;
}

Assistant:

int ProcessesView::getRowIndexByPid(const QString &pid) {
    for (int i = 0; i < model()->rowCount(); i++) {
        QString row_pid = model()->data(model()->index(i, NVSMColumns::PID)).toString();

        if (row_pid == pid) {
            return i;
        }
    }

    return -1;
}